

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glw_json.h
# Opt level: O0

bool json::save<array_float_var>(ostream *out,array_float_var *t,int tabs)

{
  byte bVar1;
  int local_34;
  undefined1 local_30 [4];
  int i;
  SaveObject serializer;
  int tabs_local;
  array_float_var *t_local;
  ostream *out_local;
  
  serializer.tabs = tabs;
  std::operator<<(out,"{\n");
  SaveObject::SaveObject((SaveObject *)local_30,out,serializer.tabs + 1);
  serialize<json::SaveObject>((SaveObject *)local_30,t);
  std::operator<<(out,"\n");
  for (local_34 = 0; local_34 < serializer.tabs; local_34 = local_34 + 1) {
    std::operator<<(out,'\t');
  }
  std::operator<<(out,'}');
  bVar1 = std::ios::fail();
  return (bool)((bVar1 ^ 0xff) & 1);
}

Assistant:

bool save(std::ostream& out, T& t, int tabs) {
	out << "{\n";
	SaveObject serializer(out, tabs + 1);
	serialize(serializer, t); // serialize should be defined for type T
	out << "\n";
	for (int i = 0; i < tabs; ++i) out << '\t';
	out << '}';
	return !out.fail();
}